

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O1

void mp::WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,PLConParams *plp)

{
  Buffer<char> *pBVar1;
  char *pcVar2;
  size_t sVar3;
  PLPoints *pPVar4;
  ulong uVar5;
  ulong uVar6;
  FormatSpec local_48;
  
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar5 = pBVar1->size_ + 9;
  if (pBVar1->capacity_ < uVar5) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
  }
  builtin_strncpy(pBVar1->ptr_ + pBVar1->size_,"plpoints[",9);
  pBVar1->size_ = uVar5;
  pPVar4 = PLConParams::GetPLPoints(plp);
  if ((pPVar4->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pPVar4->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      if (uVar5 != 0) {
        pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
        uVar6 = pBVar1->size_ + 2;
        if (pBVar1->capacity_ < uVar6) {
          (**pBVar1->_vptr_Buffer)(pBVar1,uVar6);
        }
        pcVar2 = pBVar1->ptr_;
        sVar3 = pBVar1->size_;
        (pcVar2 + sVar3)[0] = ',';
        (pcVar2 + sVar3)[1] = ' ';
        pBVar1->size_ = uVar6;
      }
      pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
      if (pBVar1->size_ == pBVar1->capacity_) {
        (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
      }
      sVar3 = pBVar1->size_;
      pBVar1->size_ = sVar3 + 1;
      pBVar1->ptr_[sVar3] = '(';
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>
                (&wrt->super_BasicWriter<char>,
                 (pPVar4->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5],&local_48);
      pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
      uVar6 = pBVar1->size_ + 2;
      if (pBVar1->capacity_ < uVar6) {
        (**pBVar1->_vptr_Buffer)(pBVar1,uVar6);
      }
      pcVar2 = pBVar1->ptr_;
      sVar3 = pBVar1->size_;
      (pcVar2 + sVar3)[0] = ',';
      (pcVar2 + sVar3)[1] = ' ';
      pBVar1->size_ = uVar6;
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>
                (&wrt->super_BasicWriter<char>,
                 (pPVar4->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5],&local_48);
      pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
      if (pBVar1->size_ == pBVar1->capacity_) {
        (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
      }
      sVar3 = pBVar1->size_;
      pBVar1->size_ = sVar3 + 1;
      pBVar1->ptr_[sVar3] = ')';
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(pPVar4->x_).super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pPVar4->x_).super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar3 = pBVar1->size_;
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = ']';
  return;
}

Assistant:

void WriteModelItemParameters(
    Writer& wrt, const PLConParams& plp) {
  wrt << "plpoints[";
  const auto& p = plp.GetPLPoints();
  for (size_t i=0; i<p.x_.size(); ++i) {
    if (i)
      wrt << ", ";
    wrt << '(' << p.x_[i] << ", " << p.y_[i] << ')';
  }
  wrt << ']';
}